

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O2

void __thiscall
boost::random::
well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_boost::random::detail::M3<-18>,_boost::random::detail::M3<-14>,_boost::random::detail::M0,_boost::random::detail::M3<18>,_boost::random::detail::M3<-24>,_boost::random::detail::M3<5>,_boost::random::detail::M3<-1>,_boost::random::detail::M0,_boost::random::detail::no_tempering>
::seed(well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_boost::random::detail::M3<_18>,_boost::random::detail::M3<_14>,_boost::random::detail::M0,_boost::random::detail::M3<18>,_boost::random::detail::M3<_24>,_boost::random::detail::M3<5>,_boost::random::detail::M3<_1>,_boost::random::detail::M0,_boost::random::detail::no_tempering>
       *this,uint *value)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = *value;
  this->state_[0] = uVar2;
  for (lVar1 = 1; lVar1 != 0x13; lVar1 = lVar1 + 1) {
    uVar2 = (uVar2 >> 0x1e ^ uVar2) * 0x6c078965 + (int)lVar1;
    this->state_[lVar1] = uVar2;
  }
  this->index_ = 0x13;
  return;
}

Assistant:

BOOST_RANDOM_DETAIL_ARITHMETIC_SEED(well_engine, UIntType, value)
    {
        // New seeding algorithm from 
        // http://www.math.sci.hiroshima-u.ac.jp/~m-mat/MT/MT2002/emt19937ar.html
        // In the previous versions, MSBs of the seed affected only MSBs of the
        // state x[].
        const UIntType mask = (max)();

        state_[0] = value & mask;
        
        std::size_t i = 1;
        UIntType (&s)[state_size] = state_;

        for ( ; i != state_size; ++i) {
            // See Knuth "The Art of Computer Programming"
            // Vol. 2, 3rd ed., page 106
            s[i] = static_cast<UIntType>((1812433253U * (s[i - 1] ^ (s[i - 1] >> (w - 2))) + i) & mask);
        }

        index_ = i;
    }